

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityParam.cpp
# Opt level: O0

void __thiscall
OpenMD::TetrahedralityParam::TetrahedralityParam
          (TetrahedralityParam *this,SimInfo *info,string *filename,string *sele,double rCut,
          int nbins)

{
  undefined1 uVar1;
  string *in_RCX;
  SelectionEvaluator *in_RDI;
  pointer in_XMM0_Qa;
  SimInfo *in_stack_00000018;
  SelectionEvaluator *in_stack_00000020;
  SimInfo *in_stack_000001c8;
  SelectionManager *in_stack_000001d0;
  undefined4 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  StaticAnalyser *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  StaticAnalyser *in_stack_ffffffffffffff30;
  SelectionManager *this_00;
  pointer *__new_size;
  NameFinder *this_01;
  string *in_stack_ffffffffffffff68;
  SelectionEvaluator *in_stack_ffffffffffffff70;
  string local_80 [32];
  string local_60 [56];
  pointer local_28;
  string *local_20;
  
  local_28 = in_XMM0_Qa;
  local_20 = in_RCX;
  StaticAnalyser::StaticAnalyser
            (in_stack_ffffffffffffff30,
             (SimInfo *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
             (string *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  *(undefined ***)&(in_RDI->compiler).filename = &PTR__TetrahedralityParam_005603e0;
  std::__cxx11::string::string((string *)&(in_RDI->compiler).cchScript,local_20);
  SelectionManager::SelectionManager(in_stack_000001d0,in_stack_000001c8);
  SelectionEvaluator::SelectionEvaluator(in_stack_00000020,in_stack_00000018);
  this_00 = (SelectionManager *)((long)&in_RDI[1].errorMessage.field_2 + 8);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1dcc81);
  __new_size = &in_RDI[1].statement.
                super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x1dcc97);
  this_01 = &in_RDI[1].nameFinder;
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x1dccad);
  getPrefix((string *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                 (char *)in_stack_ffffffffffffff20);
  StaticAnalyser::setOutputName
            (in_stack_ffffffffffffff20,
             (string *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  SelectionEvaluator::loadScriptString(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  uVar1 = SelectionEvaluator::isDynamic
                    ((SelectionEvaluator *)
                     &(in_RDI->aatoken).
                      super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!(bool)uVar1) {
    SelectionEvaluator::evaluate(in_RDI);
    SelectionManager::setSelectionSet
              (this_00,(SelectionSet *)CONCAT17(uVar1,in_stack_ffffffffffffff28));
    SelectionSet::~SelectionSet((SelectionSet *)0x1dcd88);
  }
  in_RDI[1].aatoken.
  super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_28;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_01,(size_type)__new_size);
  *(undefined8 *)&in_RDI[1].errorMessage = 0;
  in_RDI[1].errorMessage._M_string_length = 0x3ff199999999999a;
  *(double *)&in_RDI[1].errorMessage.field_2 =
       ((double)in_RDI[1].errorMessage._M_string_length - *(double *)&in_RDI[1].errorMessage) /
       (double)*(int *)&in_RDI[1].error;
  return;
}

Assistant:

TetrahedralityParam::TetrahedralityParam(SimInfo* info,
                                           const std::string& filename,
                                           const std::string& sele, double rCut,
                                           int nbins) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), seleMan_(info), evaluator_(info) {
    setOutputName(getPrefix(filename) + ".q");

    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // Set up cutoff radius:

    rCut_ = rCut;

    Q_histogram_.resize(nBins_);

    // Q can take values from 0 to 1

    MinQ_   = 0.0;
    MaxQ_   = 1.1;
    deltaQ_ = (MaxQ_ - MinQ_) / nBins_;
  }